

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(DeepScanLineInputFile *this)

{
  _func_int **pp_Var1;
  size_type sVar2;
  reference ppLVar3;
  GenericInputFile *in_RDI;
  Data *unaff_retaddr;
  size_t i;
  ulong local_10;
  
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepScanLineInputFile_004c03c0;
  if ((((ulong)in_RDI[1]._vptr_GenericInputFile[0x40] & 1) != 0) &&
     (*(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x3f] + 0x28) + 8))();
  }
  if (in_RDI[1]._vptr_GenericInputFile != (_func_int **)0x0) {
    if (((ulong)in_RDI[1]._vptr_GenericInputFile[0x30] & 1) == 0) {
      for (local_10 = 0;
          sVar2 = std::
                  vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                  ::size((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                          *)(in_RDI[1]._vptr_GenericInputFile + 0x2a)), local_10 < sVar2;
          local_10 = local_10 + 1) {
        ppLVar3 = std::
                  vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                  ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                *)(in_RDI[1]._vptr_GenericInputFile + 0x2a),local_10);
        if ((*ppLVar3)->buffer != (char *)0x0) {
          operator_delete__((*ppLVar3)->buffer);
        }
      }
    }
    if (((*(int *)((long)in_RDI[1]._vptr_GenericInputFile + 0x16c) == -1) &&
        (in_RDI[1]._vptr_GenericInputFile[0x3f] != (_func_int *)0x0)) &&
       (in_RDI[1]._vptr_GenericInputFile[0x3f] != (_func_int *)0x0)) {
      operator_delete(in_RDI[1]._vptr_GenericInputFile[0x3f],0x38);
    }
    pp_Var1 = in_RDI[1]._vptr_GenericInputFile;
    if (pp_Var1 != (_func_int **)0x0) {
      Data::~Data(unaff_retaddr);
      operator_delete(pp_Var1,0x208);
    }
  }
  GenericInputFile::~GenericInputFile(in_RDI);
  return;
}

Assistant:

DeepScanLineInputFile::~DeepScanLineInputFile ()
{
    if (_data->_deleteStream) delete _data->_streamData->is;

    if (_data)
    {
        if (!_data->memoryMapped)
            for (size_t i = 0; i < _data->lineBuffers.size (); i++)
                delete[] _data->lineBuffers[i]->buffer;

        //
        // Unless this file was opened via the multipart API, delete the streamdata
        // object too.
        // (TODO) it should be "isMultiPart(data->version)", but when there is only
        // single part,
        // (see the above constructor) the version field is not set.
        //
        // (TODO) we should have a way to tell if the stream data is owned by this
        // file or by a parent multipart file.
        //

        if (_data->partNumber == -1 && _data->_streamData)
        {
            delete _data->_streamData;
        }
        delete _data;
    }
}